

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_impls.cxx
# Opt level: O2

void __thiscall test_rpc_client::~test_rpc_client(test_rpc_client *this)

{
  (this->super_rpc_client)._vptr_rpc_client = (_func_int **)&PTR__test_rpc_client_00177df8;
  std::__cxx11::string::~string((string *)&this->port_);
  return;
}

Assistant:

test_rpc_client(msg_bus& bus, const std::string& port) : bus_(bus), port_(port)
    {
    }